

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::generateDummyCompressedData
               (CompressedTexture *dst,CompressedTexFormat *format)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  IVec3 blockPixelSize;
  Random rnd;
  int local_44;
  int local_40;
  int local_3c;
  deRandom local_38;
  
  iVar3 = tcu::getBlockSize(*format);
  tcu::getBlockPixelSize((tcu *)&local_44,*format);
  uVar6 = ((dst->m_height + local_40 + -1) / local_40) * ((dst->m_width + local_44 + -1) / local_44)
          * ((dst->m_depth + local_3c + -1) / local_3c);
  bVar2 = tcu::isAstcFormat(*format);
  if (bVar2) {
    uVar5 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar5;
    }
    for (; uVar7 * 0x10 != uVar5; uVar5 = uVar5 + 0x10) {
      puVar1 = (dst->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + (int)uVar5;
      puVar1[0] = 0xfc;
      puVar1[1] = 0xfd;
      puVar1[2] = 0xff;
      puVar1[3] = 0xff;
      puVar1[4] = 0xff;
      puVar1[5] = 0xff;
      puVar1[6] = 0xff;
      puVar1[7] = 0xff;
      puVar1[8] = 0xdf;
      puVar1[9] = 0xfb;
      puVar1[10] = '\x1c';
      puVar1[0xb] = 0xce;
      puVar1[0xc] = '6';
      puVar1[0xd] = 0xfb;
      puVar1[0xe] = 0xa0;
      puVar1[0xf] = 0xae;
    }
  }
  else {
    deRandom_init(&local_38,0xabc);
    uVar5 = 0;
    uVar7 = (ulong)(uVar6 * iVar3);
    if ((int)(uVar6 * iVar3) < 1) {
      uVar7 = uVar5;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      dVar4 = deRandom_getUint32(&local_38);
      (dst->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = (uchar)dVar4;
    }
  }
  return;
}

Assistant:

void generateDummyCompressedData (tcu::CompressedTexture& dst, const tcu::CompressedTexFormat& format)
{
	const int			blockByteSize	= tcu::getBlockSize(format);
	const tcu::IVec3	blockPixelSize	= tcu::getBlockPixelSize(format);
	const tcu::IVec3	numBlocks		(getDimensionNumBlocks(dst.getWidth(),    blockPixelSize.x()),
										 getDimensionNumBlocks(dst.getHeight(),   blockPixelSize.y()),
										 getDimensionNumBlocks(dst.getDepth(),    blockPixelSize.z()));
	const int			numTotalBlocks	= numBlocks.x() * numBlocks.y() * numBlocks.z();
	const int			dataSize		= numTotalBlocks * blockByteSize;

	DE_ASSERT(dst.getDataSize() == dataSize);

	if (tcu::isAstcFormat(format))
	{
		// generate data that is valid in LDR mode
		const int		BLOCK_SIZE			= 16;
		const deUint8	block[BLOCK_SIZE]	= { 252, 253, 255, 255, 255, 255, 255, 255, 223, 251, 28, 206, 54, 251, 160, 174 };

		DE_ASSERT(blockByteSize == BLOCK_SIZE);
		for (int ndx = 0; ndx < numTotalBlocks; ++ndx)
			deMemcpy((deUint8*)dst.getData() + ndx * BLOCK_SIZE, block, BLOCK_SIZE);
	}
	else
	{
		// any data is ok
		de::Random rnd(0xabc);

		for (int ndx = 0; ndx < dataSize; ++ndx)
			((deUint8*)dst.getData())[ndx] = rnd.getUint8();
	}
}